

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExponentiallyDecayingReservoir.cc
# Opt level: O2

shared_ptr<cppmetrics::Snapshot> __thiscall
cppmetrics::ExponentiallyDecayingReservoir::get_snapshot(ExponentiallyDecayingReservoir *this)

{
  pointer pWVar1;
  _Base_ptr p_Var2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ExponentiallyDecayingReservoir *in_RSI;
  shared_ptr<cppmetrics::Snapshot> sVar3;
  vector<cppmetrics::WeightedSample,_std::allocator<cppmetrics::WeightedSample>_> samples;
  _Vector_base<cppmetrics::WeightedSample,_std::allocator<cppmetrics::WeightedSample>_> local_68;
  vector<cppmetrics::WeightedSample,_std::allocator<cppmetrics::WeightedSample>_> local_48;
  
  rescale_if_needed(in_RSI);
  std::mutex::lock(&in_RSI->m_mutex);
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<cppmetrics::WeightedSample,_std::allocator<cppmetrics::WeightedSample>_>::reserve
            ((vector<cppmetrics::WeightedSample,_std::allocator<cppmetrics::WeightedSample>_> *)
             &local_68,(in_RSI->m_samples)._M_t._M_impl.super__Rb_tree_header._M_node_count);
  for (p_Var2 = (in_RSI->m_samples)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(in_RSI->m_samples)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    WeightedSample::WeightedSample
              ((WeightedSample *)&local_48,(WeightedSample *)&p_Var2[1]._M_parent);
    std::vector<cppmetrics::WeightedSample,_std::allocator<cppmetrics::WeightedSample>_>::
    emplace_back<cppmetrics::WeightedSample>
              ((vector<cppmetrics::WeightedSample,_std::allocator<cppmetrics::WeightedSample>_> *)
               &local_68,(WeightedSample *)&local_48);
  }
  std::
  make_shared<cppmetrics::WeightedSnapshot,std::vector<cppmetrics::WeightedSample,std::allocator<cppmetrics::WeightedSample>>>
            (&local_48);
  pWVar1 = local_48.
           super__Vector_base<cppmetrics::WeightedSample,_std::allocator<cppmetrics::WeightedSample>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_48.
  super__Vector_base<cppmetrics::WeightedSample,_std::allocator<cppmetrics::WeightedSample>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_Reservoir)._vptr_Reservoir =
       (_func_int **)
       local_48.
       super__Vector_base<cppmetrics::WeightedSample,_std::allocator<cppmetrics::WeightedSample>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (this->m_mutex).super___mutex_base._M_mutex.__align = (long)pWVar1;
  local_48.
  super__Vector_base<cppmetrics::WeightedSample,_std::allocator<cppmetrics::WeightedSample>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_48.
              super__Vector_base<cppmetrics::WeightedSample,_std::allocator<cppmetrics::WeightedSample>_>
              ._M_impl.super__Vector_impl_data._M_finish);
  std::_Vector_base<cppmetrics::WeightedSample,_std::allocator<cppmetrics::WeightedSample>_>::
  ~_Vector_base(&local_68);
  pthread_mutex_unlock((pthread_mutex_t *)&in_RSI->m_mutex);
  sVar3.super___shared_ptr<cppmetrics::Snapshot,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar3.super___shared_ptr<cppmetrics::Snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<cppmetrics::Snapshot>)
         sVar3.super___shared_ptr<cppmetrics::Snapshot,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Snapshot> ExponentiallyDecayingReservoir::get_snapshot()
{
  rescale_if_needed();

  std::lock_guard<std::mutex> lock(m_mutex);

  std::vector<WeightedSample> samples;
  samples.reserve(m_samples.size());
  std::transform(
      std::begin(m_samples), std::end(m_samples), std::back_inserter(samples),
      [](auto&& pair) { return pair.second; }
  );
  return std::make_shared<WeightedSnapshot>(std::move(samples));
}